

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::genVertexDataWithInstancing
          (VaryingOutputCountCase *this)

{
  reference pvVar1;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  undefined4 local_38;
  undefined4 local_34;
  int emitCounts [4];
  Vector<float,_4> local_20;
  VaryingOutputCountCase *local_10;
  VaryingOutputCountCase *this_local;
  
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 1;
  local_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,1);
  tcu::Vector<float,_4>::Vector(&local_20,0.0,0.0,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_20.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20.m_data._8_8_;
  if (this->m_test == READ_ATTRIBUTE) {
    local_38 = 6;
    local_34 = 0;
    emitCounts[0] = this->m_maxEmitCount;
    emitCounts[1] = 10;
    tcu::Vector<float,_4>::Vector(&local_48,6.0,0.0,(float)emitCounts[0],10.0);
    pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
    *(undefined8 *)pvVar1->m_data = local_48.m_data._0_8_;
    *(undefined8 *)(pvVar1->m_data + 2) = local_48.m_data._8_8_;
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_58,0.0,0.0,0.0,0.0);
    pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
    *(undefined8 *)pvVar1->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(pvVar1->m_data + 2) = local_58.m_data._8_8_;
  }
  return;
}

Assistant:

void VaryingOutputCountCase::genVertexDataWithInstancing (void)
{
	m_numDrawVertices = 1;

	m_vertexPosData.resize(1);
	m_vertexAttrData.resize(1);

	m_vertexPosData[0] = tcu::Vec4(0.0f,  0.0f, 0.0f, 1.0f);

	if (m_test == VaryingOutputCountShader::READ_ATTRIBUTE)
	{
		const int emitCounts[] =
		{
			(VaryingOutputCountShader::EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_0),
			(VaryingOutputCountShader::EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_1),
			(VaryingOutputCountShader::EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_2),
			(VaryingOutputCountShader::EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_3),
		};

		m_vertexAttrData[0] = tcu::Vec4((float)emitCounts[0], (float)emitCounts[1], (float)emitCounts[2], (float)emitCounts[3]);
	}
	else
	{
		// not used
		m_vertexAttrData[0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}